

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

void Pdr_ManCollectCone_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vCiObjs,Vec_Int_t *vNodes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCiObjs_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrTsim.c"
                  ,0x50,
                  "void Pdr_ManCollectCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Pdr_ManCollectCone_rec(pAig,pAVar2,vCiObjs,vNodes);
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        pAVar2 = Aig_ObjFanin1(pObj);
        Pdr_ManCollectCone_rec(pAig,pAVar2,vCiObjs,vNodes);
        iVar1 = Aig_ObjId(pObj);
        Vec_IntPush(vNodes,iVar1);
      }
    }
    else {
      iVar1 = Aig_ObjId(pObj);
      Vec_IntPush(vCiObjs,iVar1);
    }
  }
  return;
}

Assistant:

void Pdr_ManCollectCone_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vCiObjs, Vec_Int_t * vNodes )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vCiObjs, Aig_ObjId(pObj) );
        return;
    }
    Pdr_ManCollectCone_rec( pAig, Aig_ObjFanin0(pObj), vCiObjs, vNodes );
    if ( Aig_ObjIsCo(pObj) )
        return;
    Pdr_ManCollectCone_rec( pAig, Aig_ObjFanin1(pObj), vCiObjs, vNodes );
    Vec_IntPush( vNodes, Aig_ObjId(pObj) );
}